

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int lws_system_blob_get_single_ptr(lws_system_blob_t *b,uint8_t **ptr)

{
  lws_buflist *plVar1;
  
  plVar1 = (b->u).bl;
  if (b->is_direct == '\0') {
    if (plVar1 == (lws_buflist *)0x0) {
      return -1;
    }
    if (plVar1->next != (lws_buflist *)0x0) {
      return -1;
    }
    plVar1 = plVar1 + 1;
  }
  *ptr = (uint8_t *)plVar1;
  return 0;
}

Assistant:

int
lws_system_blob_get_single_ptr(lws_system_blob_t *b, const uint8_t **ptr)
{
	if (b->is_direct) {
		*ptr = b->u.direct.ptr;
		return 0;
	}

	if (!b->u.bl)
		return -1;

	if (b->u.bl->next)
		return -1;  /* multipart buflist, no single pointer to it all */

	*ptr = (const uint8_t *)&b->u.bl[1];

	return 0;
}